

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)8>_> *
anon_unknown.dwarf_a90872::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,DeviceInterface *vkdi,
          VkDevice *device,Allocator *allocator,size_t numBytes,AllocationMp *outMemory)

{
  Allocation *pAVar1;
  Allocation *pAVar2;
  VkResult result;
  AllocationMp bufferMemory;
  VkMemoryRequirements requirements;
  VkBufferCreateInfo bufferCreateInfo;
  Allocation *local_88 [2];
  VkMemoryRequirements local_78;
  VkBufferCreateInfo local_60;
  
  local_60.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.usage = 0x20;
  local_60.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_60.queueFamilyIndexCount = 0;
  local_60.pQueueFamilyIndices = (deUint32 *)0x0;
  local_60.size = numBytes;
  ::vk::createBuffer(__return_storage_ptr__,vkdi,*device,&local_60,(VkAllocationCallbacks *)0x0);
  ::vk::getBufferMemoryRequirements
            (&local_78,vkdi,*device,
             (VkBuffer)
             (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.
             m_internal);
  (*allocator->_vptr_Allocator[3])(local_88,allocator,&local_78,1);
  result = (*vkdi->_vptr_DeviceInterface[0xc])
                     (vkdi,*device,
                      (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data
                      .object.m_internal,(local_88[0]->m_memory).m_internal,local_88[0]->m_offset);
  ::vk::checkResult(result,
                    "vkdi.bindBufferMemory(device, *buffer, bufferMemory->getMemory(), bufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/spirv_assembly/vktSpvAsmComputeShaderCase.cpp"
                    ,0x46);
  pAVar2 = local_88[0];
  local_88[0] = (Allocation *)0x0;
  pAVar1 = (outMemory->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data
           .ptr;
  if (pAVar1 != pAVar2) {
    if (pAVar1 != (Allocation *)0x0) {
      (*pAVar1->_vptr_Allocation[1])();
      (outMemory->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr
           = (Allocation *)0x0;
    }
    (outMemory->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr =
         pAVar2;
  }
  if (local_88[0] != (Allocation *)0x0) {
    (*local_88[0]->_vptr_Allocation[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> createBufferAndBindMemory (const DeviceInterface& vkdi, const VkDevice& device, Allocator& allocator, size_t numBytes, AllocationMp* outMemory)
{
	const VkBufferCreateInfo bufferCreateInfo =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		numBytes,								// size
		VK_BUFFER_USAGE_STORAGE_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		0u,										// queueFamilyCount
		DE_NULL,								// pQueueFamilyIndices
	};

	Move<VkBuffer>				buffer			(createBuffer(vkdi, device, &bufferCreateInfo));
	const VkMemoryRequirements	requirements	= getBufferMemoryRequirements(vkdi, device, *buffer);
	AllocationMp				bufferMemory	= allocator.allocate(requirements, MemoryRequirement::HostVisible);

	VK_CHECK(vkdi.bindBufferMemory(device, *buffer, bufferMemory->getMemory(), bufferMemory->getOffset()));
	*outMemory = bufferMemory;

	return buffer;
}